

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O2

void __thiscall OpenMD::GofRAngle::preProcess(GofRAngle *this)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pdVar3;
  uint uVar4;
  ulong uVar5;
  pointer pdVar6;
  
  pvVar1 = (this->avgGofr_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->avgGofr_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (uVar4 = 0; uVar5 = (ulong)uVar4, uVar5 < (ulong)(((long)pvVar2 - (long)pvVar1) / 0x18);
      uVar4 = uVar4 + 1) {
    pdVar3 = *(pointer *)
              ((long)&pvVar1[uVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + 8);
    for (pdVar6 = pvVar1[uVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start; pdVar6 != pdVar3; pdVar6 = pdVar6 + 1) {
      *pdVar6 = 0.0;
    }
  }
  return;
}

Assistant:

void GofRAngle::preProcess() {
    for (unsigned int i = 0; i < avgGofr_.size(); ++i) {
      std::fill(avgGofr_[i].begin(), avgGofr_[i].end(), 0);
    }
  }